

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vision.c
# Opt level: O1

int q3_path(int srow,int scol,int y2,int x2)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  
  iVar5 = scol - x2;
  iVar4 = y2 - srow;
  iVar1 = iVar5 * 2;
  iVar2 = iVar4 * 2;
  if (iVar5 < iVar4) {
    if (iVar4 != 1) {
      uVar3 = iVar1 - iVar4;
      lVar6 = 1;
      do {
        scol = ((int)~uVar3 >> 0x1f) + scol;
        if (viz_clear_rows[lVar6 + srow][scol] == '\0') {
          return 0;
        }
        iVar5 = 0;
        if (-1 < (int)uVar3) {
          iVar5 = iVar2;
        }
        uVar3 = (uVar3 + iVar1) - iVar5;
        lVar6 = lVar6 + 1;
      } while (iVar4 != (int)lVar6);
    }
  }
  else if (iVar5 != 1) {
    uVar3 = iVar2 - iVar5;
    lVar6 = (long)scol;
    iVar4 = (x2 - scol) + 1;
    do {
      lVar6 = lVar6 + -1;
      srow = srow - ((int)~uVar3 >> 0x1f);
      if (viz_clear_rows[srow][lVar6] == '\0') {
        return 0;
      }
      iVar5 = 0;
      if (-1 < (int)uVar3) {
        iVar5 = iVar1;
      }
      uVar3 = (uVar3 + iVar2) - iVar5;
      iVar4 = iVar4 + 1;
    } while (iVar4 != 0);
  }
  return 1;
}

Assistant:

static int q3_path(int srow, int scol, int y2, int x2)
{
    int dx, dy;
    int k, err, x, y, dxs, dys;

    x  = scol;		y  = srow;
    dx = x - x2;	dy = y2 - y;

    dxs = dx << 1;	   /* save the shifted values */
    dys = dy << 1;
    if (dy > dx) {
	err = dxs - dy;

	for (k = dy-1; k; k--) {
	    if (err >= 0) {
		x--;
		err -= dys;
	    }
	    y++;
	    err += dxs;
	    if (!is_clear(y,x)) return 0; /* blocked */
	}
    } else {
	err = dys - dx;

	for (k = dx-1; k; k--) {
	    if (err >= 0) {
		y++;
		err -= dxs;
	    }
	    x--;
	    err += dys;
	    if (!is_clear(y,x)) return 0;/* blocked */
	}
    }

    return 1;
}